

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_sparse.c
# Opt level: O0

void __thiscall
lu_solve_sparse(lu *this,lu_int nrhs,lu_int *irhs,double *xrhs,lu_int *p_nlhs,lu_int *ilhs,
               double *xlhs,char trans)

{
  double droptol_00;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  lu_int *index;
  double *value;
  double *value_00;
  lu_int *index_00;
  double *value_01;
  long lVar11;
  int iVar12;
  lu_int lVar13;
  int iVar14;
  lu_int lVar15;
  int iVar16;
  lu_int *plVar17;
  lu_int *plVar18;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  lu_int *in_R8;
  lu_int *in_R9;
  double dVar19;
  double *in_stack_00000008;
  char in_stack_00000010;
  lu_int *pstack_1;
  double *work_1;
  lu_int *pattern_1;
  lu_int *pattern_symb_1;
  lu_int *pstack;
  double *work;
  lu_int *pattern;
  lu_int *pattern_symb;
  lu_int Rflops;
  lu_int Uflops;
  lu_int Lflops;
  double x;
  lu_int M;
  lu_int nz_symb;
  lu_int nz;
  lu_int jpivot;
  lu_int ipivot;
  lu_int pos;
  lu_int top;
  lu_int t;
  lu_int n;
  lu_int k;
  lu_int j;
  lu_int i;
  lu_int *marked;
  double *Wvalue;
  lu_int *Windex;
  double *Uvalue;
  lu_int *Uindex;
  double *Lvalue;
  lu_int *Lindex;
  double *row_pivot;
  double *col_pivot;
  lu_int *Wend;
  lu_int *Wbegin;
  lu_int *Rbegin;
  lu_int *Ubegin;
  lu_int *Ltbegin_p;
  lu_int *Ltbegin;
  lu_int *Lbegin;
  lu_int *pivotrow;
  lu_int *pivotcol;
  lu_int *eta_row;
  lu_int *qmap;
  lu_int *pmap;
  lu_int *p;
  double droptol;
  lu_int nz_sparse;
  lu_int pivotlen;
  lu_int nforrest;
  lu_int m;
  lu_int *in_stack_fffffffffffffe78;
  lu_int *plVar20;
  undefined8 in_stack_fffffffffffffe80;
  double *pdVar21;
  lu_int *in_stack_fffffffffffffe88;
  lu_int *in_stack_fffffffffffffe90;
  lu_int *plVar22;
  lu_int *in_stack_fffffffffffffe98;
  lu_int *plVar23;
  undefined8 in_stack_fffffffffffffea0;
  double *pdVar24;
  lu_int *in_stack_fffffffffffffeb0;
  lu_int *plVar25;
  uint in_stack_fffffffffffffeb8;
  int iVar26;
  int iVar27;
  int iVar28;
  double in_stack_fffffffffffffec8;
  int local_128;
  int local_11c;
  int local_114;
  int local_110;
  int local_10c;
  
  lVar13 = (lu_int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  lVar15 = (lu_int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_10c = *(int *)(in_RDI + 0x54);
  iVar1 = *(int *)(in_RDI + 0x68);
  iVar14 = *(int *)(in_RDI + 400);
  iVar12 = (int)(*(double *)(in_RDI + 0x48) * (double)local_10c);
  droptol_00 = *(double *)(in_RDI + 0x10);
  lVar3 = *(long *)(in_RDI + 0x250);
  lVar4 = *(long *)(in_RDI + 0x260);
  lVar5 = *(long *)(in_RDI + 0x270);
  lVar6 = *(long *)(in_RDI + 0x200);
  lVar7 = *(long *)(in_RDI + 0x1d8);
  lVar8 = *(long *)(in_RDI + 0x1e8);
  plVar25 = *(lu_int **)(in_RDI + 0x220);
  plVar22 = *(lu_int **)(in_RDI + 0x230);
  lVar9 = *(long *)(in_RDI + 0x240);
  plVar23 = *(lu_int **)(in_RDI + 0x280);
  piVar10 = *(int **)(in_RDI + 0x1f8);
  plVar20 = *(lu_int **)(in_RDI + 0x218);
  plVar18 = *(lu_int **)(in_RDI + 0x228);
  pdVar21 = *(double **)(in_RDI + 0x2a8);
  pdVar24 = *(double **)(in_RDI + 0x2b0);
  index = *(lu_int **)(in_RDI + 0x1a0);
  value = *(double **)(in_RDI + 0x1b8);
  plVar17 = *(lu_int **)(in_RDI + 0x1a8);
  value_00 = *(double **)(in_RDI + 0x1c0);
  index_00 = *(lu_int **)(in_RDI + 0x1b0);
  value_01 = *(double **)(in_RDI + 0x1c8);
  lVar11 = *(long *)(in_RDI + 0x290);
  iVar28 = 0;
  iVar27 = 0;
  iVar26 = 0;
  if ((in_stack_00000010 == 't') || (in_stack_00000010 == 'T')) {
    plVar25 = *(lu_int **)(in_RDI + 0x210);
    plVar17 = (lu_int *)(*(long *)(in_RDI + 0x210) + (long)local_10c * 4);
    pdVar24 = *(double **)(in_RDI + 0x298);
    plVar23 = *(lu_int **)(in_RDI + 0x2a0);
    *(int *)(in_RDI + 0x18c) = *(int *)(in_RDI + 0x18c) + 1;
    lVar13 = lu_solve_symbolic((lu_int)((ulong)pdVar24 >> 0x20),plVar23,in_stack_fffffffffffffe90,
                               in_stack_fffffffffffffe88,lVar15,in_stack_fffffffffffffe78,plVar25,
                               (lu_int *)(ulong)in_stack_fffffffffffffeb8,(lu_int *)0x0,
                               SUB84(in_stack_fffffffffffffec8,0));
    for (local_110 = 0; local_110 < in_ESI; local_110 = local_110 + 1) {
      pdVar24[*(int *)(in_RDX + (long)local_110 * 4)] = *(double *)(in_RCX + (long)local_110 * 8);
    }
    local_128 = lu_solve_triangular(local_10c - lVar13,plVar25 + lVar13,plVar20,plVar18,index_00,
                                    value_01,pdVar21,droptol_00,pdVar24,plVar17,
                                    (lu_int *)&stack0xfffffffffffffec0);
    iVar14 = *(int *)(in_RDI + 0x18c) + 1;
    *(int *)(in_RDI + 0x18c) = iVar14;
    for (local_110 = 0; local_110 < local_128; local_110 = local_110 + 1) {
      iVar16 = plVar17[local_110];
      iVar2 = *(int *)(lVar4 + (long)iVar16 * 4);
      plVar17[local_110] = iVar2;
      in_stack_00000008[iVar2] = pdVar24[iVar16];
      pdVar24[iVar16] = 0.0;
      *(int *)(lVar11 + (long)iVar2 * 4) = iVar14;
    }
    while (iVar16 = iVar1, local_114 = iVar16 + -1, -1 < local_114) {
      iVar2 = *(int *)(lVar6 + (long)local_114 * 4);
      iVar1 = local_114;
      if ((in_stack_00000008[iVar2] != 0.0) || (NAN(in_stack_00000008[iVar2]))) {
        in_stack_fffffffffffffec8 = in_stack_00000008[iVar2];
        for (local_11c = piVar10[local_114]; local_11c < piVar10[iVar16]; local_11c = local_11c + 1)
        {
          iVar2 = index[local_11c];
          if (*(int *)(lVar11 + (long)iVar2 * 4) != iVar14) {
            *(int *)(lVar11 + (long)iVar2 * 4) = iVar14;
            plVar17[local_128] = iVar2;
            local_128 = local_128 + 1;
          }
          in_stack_00000008[iVar2] =
               -in_stack_fffffffffffffec8 * value[local_11c] + in_stack_00000008[iVar2];
          iVar26 = iVar26 + 1;
        }
      }
    }
    if (iVar12 < local_128) {
      local_128 = 0;
      while (local_10c = local_10c + -1, -1 < local_10c) {
        iVar1 = *(int *)(lVar3 + (long)local_10c * 4);
        if ((in_stack_00000008[iVar1] != 0.0) || (NAN(in_stack_00000008[iVar1]))) {
          dVar19 = in_stack_00000008[iVar1];
          for (local_11c = *(int *)(lVar9 + (long)local_10c * 4); iVar14 = index[local_11c],
              -1 < iVar14; local_11c = local_11c + 1) {
            in_stack_00000008[iVar14] = -dVar19 * value[local_11c] + in_stack_00000008[iVar14];
            iVar28 = iVar28 + 1;
          }
          if (ABS(dVar19) <= droptol_00) {
            in_stack_00000008[iVar1] = 0.0;
          }
          else {
            in_R9[local_128] = iVar1;
            local_128 = local_128 + 1;
          }
        }
      }
      *in_R8 = local_128;
    }
    else {
      *(int *)(in_RDI + 0x18c) = *(int *)(in_RDI + 0x18c) + 1;
      lVar15 = lu_solve_symbolic((lu_int)((ulong)pdVar24 >> 0x20),plVar23,in_stack_fffffffffffffe90,
                                 in_stack_fffffffffffffe88,lVar15,in_stack_fffffffffffffe78,plVar25,
                                 (lu_int *)CONCAT44(iVar26,in_stack_fffffffffffffeb8),
                                 (lu_int *)CONCAT44(iVar28,iVar27),
                                 SUB84(in_stack_fffffffffffffec8,0));
      lVar15 = lu_solve_triangular(local_10c - lVar15,plVar25 + lVar15,plVar22,(lu_int *)0x0,index,
                                   value,(double *)0x0,droptol_00,in_stack_00000008,in_R9,
                                   (lu_int *)&stack0xfffffffffffffec4);
      *in_R8 = lVar15;
    }
  }
  else {
    plVar22 = *(lu_int **)(in_RDI + 0x210);
    plVar18 = (lu_int *)(*(long *)(in_RDI + 0x210) + (long)local_10c * 4);
    pdVar21 = *(double **)(in_RDI + 0x298);
    plVar20 = *(lu_int **)(in_RDI + 0x2a0);
    iVar16 = *(int *)(in_RDI + 0x18c) + 1;
    *(int *)(in_RDI + 0x18c) = iVar16;
    local_114 = lu_solve_symbolic(lVar13,in_stack_fffffffffffffe98,plVar22,plVar18,
                                  (lu_int)((ulong)pdVar21 >> 0x20),plVar20,in_stack_fffffffffffffeb0
                                  ,(lu_int *)(ulong)in_stack_fffffffffffffeb8,(lu_int *)0x0,
                                  SUB84(in_stack_fffffffffffffec8,0));
    for (local_110 = 0; local_110 < in_ESI; local_110 = local_110 + 1) {
      pdVar21[*(int *)(in_RDX + (long)local_110 * 4)] = *(double *)(in_RCX + (long)local_110 * 8);
    }
    local_128 = lu_solve_triangular(local_10c - local_114,plVar22 + local_114,plVar25,(lu_int *)0x0,
                                    index,value,(double *)0x0,droptol_00,pdVar21,plVar18,
                                    (lu_int *)&stack0xfffffffffffffec4);
    if (local_128 < local_10c - local_114) {
      local_110 = 0;
      while (local_110 < local_128) {
        iVar2 = plVar22[local_114];
        if (iVar2 == plVar18[local_110]) {
          local_110 = local_110 + 1;
        }
        else {
          *(int *)(lVar11 + (long)iVar2 * 4) = *(int *)(lVar11 + (long)iVar2 * 4) + -1;
        }
        local_114 = local_114 + 1;
      }
      for (; local_114 < local_10c; local_114 = local_114 + 1) {
        *(int *)(lVar11 + (long)plVar22[local_114] * 4) =
             *(int *)(lVar11 + (long)plVar22[local_114] * 4) + -1;
      }
    }
    local_11c = *piVar10;
    for (local_114 = 0; local_114 < iVar1; local_114 = local_114 + 1) {
      iVar2 = *(int *)(lVar6 + (long)local_114 * 4);
      in_stack_fffffffffffffec8 = 0.0;
      for (; local_11c < piVar10[local_114 + 1]; local_11c = local_11c + 1) {
        in_stack_fffffffffffffec8 =
             pdVar21[index[local_11c]] * value[local_11c] + in_stack_fffffffffffffec8;
      }
      pdVar21[iVar2] = pdVar21[iVar2] - in_stack_fffffffffffffec8;
      if (((in_stack_fffffffffffffec8 != 0.0) || (NAN(in_stack_fffffffffffffec8))) &&
         (*(int *)(lVar11 + (long)iVar2 * 4) != iVar16)) {
        *(int *)(lVar11 + (long)iVar2 * 4) = iVar16;
        plVar18[local_128] = iVar2;
        local_128 = local_128 + 1;
      }
    }
    iVar26 = (piVar10[iVar1] - *piVar10) + iVar26;
    if (iVar12 < local_128) {
      local_128 = 0;
      local_10c = iVar14;
      while (local_10c = local_10c + -1, -1 < local_10c) {
        iVar1 = *(int *)(lVar8 + (long)local_10c * 4);
        iVar14 = *(int *)(lVar7 + (long)local_10c * 4);
        if ((pdVar21[iVar1] != 0.0) || (NAN(pdVar21[iVar1]))) {
          dVar19 = pdVar21[iVar1] / pdVar24[iVar1];
          pdVar21[iVar1] = 0.0;
          for (local_11c = plVar23[iVar1]; iVar1 = plVar17[local_11c], -1 < iVar1;
              local_11c = local_11c + 1) {
            pdVar21[iVar1] = -dVar19 * value_00[local_11c] + pdVar21[iVar1];
            iVar27 = iVar27 + 1;
          }
          if (droptol_00 < ABS(dVar19)) {
            in_R9[local_128] = iVar14;
            in_stack_00000008[iVar14] = dVar19;
            local_128 = local_128 + 1;
          }
        }
      }
    }
    else {
      *(int *)(in_RDI + 0x18c) = *(int *)(in_RDI + 0x18c) + 1;
      lVar15 = lu_solve_symbolic(lVar13,in_stack_fffffffffffffe98,plVar22,plVar18,
                                 (lu_int)((ulong)pdVar21 >> 0x20),plVar20,in_stack_fffffffffffffeb0,
                                 (lu_int *)CONCAT44(iVar26,in_stack_fffffffffffffeb8),
                                 (lu_int *)CONCAT44(iVar28,iVar27),
                                 SUB84(in_stack_fffffffffffffec8,0));
      local_128 = lu_solve_triangular(local_10c - lVar15,plVar22 + lVar15,plVar23,(lu_int *)0x0,
                                      plVar17,value_00,pdVar24,droptol_00,pdVar21,in_R9,
                                      (lu_int *)&stack0xfffffffffffffec0);
      for (local_110 = 0; local_110 < local_128; local_110 = local_110 + 1) {
        iVar1 = in_R9[local_110];
        iVar14 = *(int *)(lVar5 + (long)iVar1 * 4);
        in_R9[local_110] = iVar14;
        in_stack_00000008[iVar14] = pdVar21[iVar1];
        pdVar21[iVar1] = 0.0;
      }
    }
    *in_R8 = local_128;
  }
  *(int *)(in_RDI + 0xe0) = iVar28 + *(int *)(in_RDI + 0xe0);
  *(int *)(in_RDI + 0xe4) = iVar27 + *(int *)(in_RDI + 0xe4);
  *(int *)(in_RDI + 0xe8) = iVar26 + *(int *)(in_RDI + 0xe8);
  *(double *)(in_RDI + 0xa0) = (double)iVar26 + *(double *)(in_RDI + 0xa0);
  return;
}

Assistant:

void lu_solve_sparse(
    struct lu *this, const lu_int nrhs, const lu_int *irhs, const double *xrhs,
    lu_int *p_nlhs, lu_int *ilhs, double *xlhs, char trans)
{
    const lu_int m                  = this->m;
    const lu_int nforrest           = this->nforrest;
    const lu_int pivotlen           = this->pivotlen;
    const lu_int nz_sparse          = this->sparse_thres * m;
    const double droptol            = this->droptol;
    const lu_int *p                 = this->p;
    const lu_int *pmap              = this->pmap;
    const lu_int *qmap              = this->qmap;
    const lu_int *eta_row           = this->eta_row;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin            = this->Lbegin;
    const lu_int *Ltbegin           = this->Ltbegin;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const lu_int *Rbegin            = this->Rbegin;
    const lu_int *Wbegin            = this->Wbegin;
    const lu_int *Wend              = this->Wend;
    const double *col_pivot         = this->col_pivot;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    const lu_int *Windex            = this->Windex;
    const double *Wvalue            = this->Wvalue;
    lu_int *marked                  = this->marked;

    lu_int i, j, k, n, t, top, pos, ipivot, jpivot, nz, nz_symb, M;
    double x;

    lu_int Lflops = 0, Uflops = 0, Rflops = 0;

    if (trans == 't' || trans == 'T')
    {
        /* ----------------------- */
        /* Solve transposed system */
        /* ----------------------- */

        lu_int *pattern_symb = this->iwork1;
        lu_int *pattern      = this->iwork1 + m;
        double *work         = this->work0;
        lu_int *pstack       = (void *) this->work1;
        assert(sizeof(lu_int) <= sizeof(double));

        /*
         * Sparse triangular solve with U'.
         * Solution scattered into work, indices in pattern[0..nz-1].
         */
        M = ++this->marker;
        top = lu_solve_symbolic(m, Wbegin, Wend, Windex, nrhs, irhs,
                                pattern_symb, pstack, marked, M);
        nz_symb = m-top;

        for (n = 0; n < nrhs; n++)
            work[irhs[n]] = xrhs[n];
        nz = lu_solve_triangular(nz_symb, pattern_symb+top, Wbegin, Wend,
                                 Windex, Wvalue, col_pivot, droptol, work,
                                 pattern, &Uflops);

        /*
         * Permute solution into xlhs.
         * Map pattern from column indices to row indices.
         */
        M = ++this->marker;
        for (n = 0; n < nz; n++)
        {
            j = pattern[n];
            i = pmap[j];
            pattern[n] = i;
            xlhs[i] = work[j];
            work[j] = 0;
            marked[i] = M;
        }

        /*
         * Solve with update etas.
         * Append fill-in to pattern.
         */
        for (t = nforrest-1; t >= 0; t--)
        {
            ipivot = eta_row[t];
            if (xlhs[ipivot])
            {
                x = xlhs[ipivot];
                for (pos = Rbegin[t]; pos < Rbegin[t+1]; pos++)
                {
                    i = Lindex[pos];
                    if (marked[i] != M)
                    {
                        marked[i] = M;
                        pattern[nz++] = i;
                    }
                    xlhs[i] -= x * Lvalue[pos];
                    Rflops++;
                }
            }
        }

        if (nz <= nz_sparse)
        {
            /*
             * Sparse triangular solve with L'.
             * Solution scattered into xlhs, indices in ilhs[0..nz-1].
             */
            M = ++this->marker;
            top = lu_solve_symbolic(m, Ltbegin, NULL, Lindex, nz, pattern,
                                    pattern_symb, pstack, marked, M);
            nz_symb = m-top;

            nz = lu_solve_triangular(nz_symb, pattern_symb+top, Ltbegin, NULL,
                                      Lindex, Lvalue, NULL, droptol, xlhs, ilhs,
                                      &Lflops);
            *p_nlhs = nz;
        }
        else
        {
            /*
             * Sequential triangular solve with L'.
             * Solution scattered into xlhs, indices in ilhs[0..nz-1].
             */
            nz = 0;
            for (k = m-1; k >= 0; k--)
            {
                ipivot = p[k];
                if (xlhs[ipivot])
                {
                    x = xlhs[ipivot];
                    for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
                    {
                        xlhs[i] -= x * Lvalue[pos];
                        Lflops++;
                    }
                    if (fabs(x) > droptol)
                        ilhs[nz++] = ipivot;
                    else
                        xlhs[ipivot] = 0.0;
                }
            }
            *p_nlhs = nz;
        }
    }
    else
    {
        /* -------------------- */
        /* Solve forward system */
        /* -------------------- */

        lu_int *pattern_symb = this->iwork1;
        lu_int *pattern      = this->iwork1 + m;
        double *work         = this->work0;
        lu_int *pstack       = (void *) this->work1;
        assert(sizeof(lu_int) <= sizeof(double));

        /*
         * Sparse triangular solve with L.
         * Solution scattered into work, indices in pattern[0..nz-1].
         */
        M = ++this->marker;
        top = lu_solve_symbolic(m, Lbegin, NULL, Lindex, nrhs, irhs,
                                pattern_symb, pstack, marked, M);
        nz_symb = m-top;

        for (n = 0; n < nrhs; n++)
            work[irhs[n]] = xrhs[n];
        nz = lu_solve_triangular(nz_symb, pattern_symb+top, Lbegin, NULL,
                                 Lindex, Lvalue, NULL, droptol, work, pattern,
                                 &Lflops);

        /* unmark cancellation */
        if (nz < nz_symb)
        {
            for (t = top, n = 0; n < nz; t++)
            {
                i = pattern_symb[t];
                if (i == pattern[n])
                    n++;
                else
                    marked[i]--;
            }
            for ( ; t < m; t++)
                marked[pattern_symb[t]]--;
        }

        /*
         * Solve with update etas.
         * Append fill-in to pattern.
         */
        pos = Rbegin[0];
        for (t = 0; t < nforrest; t++)
        {
            ipivot = eta_row[t];
            x = 0.0;
            for ( ; pos < Rbegin[t+1]; pos++)
            {
                x += work[Lindex[pos]] * Lvalue[pos];
            }
            work[ipivot] -= x;
            if (x && marked[ipivot] != M)
            {
                marked[ipivot] = M;
                pattern[nz++] = ipivot;
            }
        }
        Rflops += Rbegin[nforrest] - Rbegin[0];

        if (nz <= nz_sparse)
        {
            /*
             * Sparse triangular solve with U.
             * Solution scattered into work, indices in ilhs[0..nz-1].
             */
            M = ++this->marker;
            top = lu_solve_symbolic(m, Ubegin, NULL, Uindex, nz, pattern,
                                    pattern_symb, pstack, marked, M);
            nz_symb = m-top;

            nz = lu_solve_triangular(nz_symb, pattern_symb+top, Ubegin, NULL,
                                     Uindex, Uvalue, row_pivot, droptol, work,
                                     ilhs, &Uflops);

            /*
             * Permute solution into xlhs.
             * Map pattern from row indices to column indices.
             */
            for (n = 0; n < nz; n++)
            {
                i = ilhs[n];
                j = qmap[i];
                ilhs[n] = j;
                xlhs[j] = work[i];
                work[i] = 0;
            }
        }
        else
        {
            /*
             * Sequential triangular solve with U.
             * Solution computed in work and permuted into xlhs.
             * Pattern (in column indices) stored in ilhs[0..nz-1].
             */
            nz = 0;
            for (k = pivotlen-1; k >= 0; k--)
            {
                ipivot = pivotrow[k];
                jpivot = pivotcol[k];
                if (work[ipivot])
                {
                    x = work[ipivot] / row_pivot[ipivot];
                    work[ipivot] = 0.0;
                    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
                    {
                        work[i] -= x * Uvalue[pos];
                        Uflops++;
                    }
                    if (fabs(x) > droptol)
                    {
                        ilhs[nz++] = jpivot;
                        xlhs[jpivot] = x;
                    }
                }
            }
        }
        *p_nlhs = nz;
    }

    this->Lflops += Lflops;
    this->Uflops += Uflops;
    this->Rflops += Rflops;
    this->update_cost_numer += Rflops;
}